

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *in,QRegularExpression *re)

{
  QDataStream *this;
  long in_FS_OFFSET;
  quint32 patternOptions;
  QFlagsStorage<QRegularExpression::PatternOption> local_3c;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  local_3c.i = 0xaaaaaaaa;
  this = operator>>(in,(QString *)&local_38);
  QDataStream::operator>>(this,(qint32 *)&local_3c);
  QRegularExpression::setPattern(re,(QString *)&local_38);
  QRegularExpression::setPatternOptions(re,(PatternOptions)local_3c.i);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QRegularExpression &re)
{
    QString pattern;
    quint32 patternOptions;
    in >> pattern >> patternOptions;
    re.setPattern(pattern);
    re.setPatternOptions(QRegularExpression::PatternOptions::fromInt(patternOptions));
    return in;
}